

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O1

MutAlgebraicCon __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCon
          (BasicProblem<mp::BasicProblemParams<int>_> *this,double lb,double ub)

{
  pointer pAVar1;
  pointer pAVar2;
  MutAlgebraicCon MVar3;
  AlgebraicConInfo local_a0;
  
  pAVar1 = (this->algebraic_cons_).
           super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pAVar2 = (this->algebraic_cons_).
           super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_a0.linear_expr.terms_.super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.
  m_data.super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_data_ptr =
       (ptr)&local_a0.linear_expr.terms_.
             super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data.m_storage;
  local_a0.linear_expr.terms_.super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.
  m_data.super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_capacity = 6;
  local_a0.linear_expr.terms_.super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.
  m_data.super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_size = 0;
  local_a0.lb = lb;
  local_a0.ub = ub;
  std::
  vector<mp::BasicProblem<mp::BasicProblemParams<int>>::AlgebraicConInfo,std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>>::AlgebraicConInfo>>
  ::emplace_back<mp::BasicProblem<mp::BasicProblemParams<int>>::AlgebraicConInfo>
            ((vector<mp::BasicProblem<mp::BasicProblemParams<int>>::AlgebraicConInfo,std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>>::AlgebraicConInfo>>
              *)&this->algebraic_cons_,&local_a0);
  if (6 < local_a0.linear_expr.terms_.
          super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data.
          super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_capacity) {
    operator_delete(local_a0.linear_expr.terms_.
                    super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data.
                    super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_data_ptr,
                    local_a0.linear_expr.terms_.
                    super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data.
                    super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_capacity
                    << 4);
  }
  MVar3.
  super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_ =
       (int)((ulong)((long)pAVar2 - (long)pAVar1) >> 3) * -0xf0f0f0f;
  MVar3.
  super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_ = this;
  MVar3.
  super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>._12_4_ = 0;
  return (MutAlgebraicCon)
         MVar3.
         super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
         .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>;
}

Assistant:

MutAlgebraicCon AddCon(double lb, double ub) {
    std::size_t num_cons = algebraic_cons_.size();
    MP_ASSERT(num_cons < MP_MAX_PROBLEM_ITEMS,
              "too many algebraic constraints");
    algebraic_cons_.push_back(AlgebraicConInfo(lb, ub));
    return MutAlgebraicCon(this, static_cast<int>(num_cons));
  }